

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O1

bool __thiscall
stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>::executeCycle
          (Microthread<implementations::scheme::SchemeImplementation> *this)

{
  bool bVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  
  bVar1 = this->sleeping;
  if (bVar1 == false) {
    peVar2 = (this->impl).
             super___shared_ptr<implementations::scheme::SchemeImplementation,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar3 = (**(peVar2->
               super_Implementation<implementations::scheme::environment,_implementations::scheme::SchemeFrame>
               )._vptr_Implementation)(peVar2);
    (*(peVar2->
      super_Implementation<implementations::scheme::environment,_implementations::scheme::SchemeFrame>
      )._vptr_Implementation[1])(peVar2,CONCAT44(extraout_var,iVar3));
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool executeCycle() {
				if (sleeping) {
					//std::cerr << "executeCycle() abort due to sleeping" << std::endl;
					return false;
				}
				//return
				impl->execute();
				return true;
			}